

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O2

void __thiscall cppcms::rpc::json_call::return_result(json_call *this,context *c,value *result)

{
  response *prVar1;
  ostream *poVar2;
  allocator local_49;
  string local_48;
  
  prVar1 = http::context::response(c);
  std::__cxx11::string::string((string *)&local_48,"application/json",&local_49);
  http::response::set_content_header(prVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  prVar1 = http::context::response(c);
  poVar2 = http::response::out(prVar1);
  poVar2 = std::operator<<(poVar2,"{\"id\":");
  poVar2 = json::operator<<(poVar2,&this->id_);
  poVar2 = std::operator<<(poVar2,",\"error\":null,\"result\":");
  poVar2 = json::operator<<(poVar2,result);
  std::operator<<(poVar2,"}");
  return;
}

Assistant:

void json_call::return_result(http::context &c,json::value const &result)
	{
		c.response().set_content_header("application/json");
		c.response().out() <<
			"{\"id\":"<<id_<<",\"error\":null,\"result\":"<<result<<"}";
	}